

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O3

void lysp_ext_free(lysf_ctx *ctx,lysp_ext *ext)

{
  ly_bool lVar1;
  lysp_ext_instance *plVar2;
  lysc_ext_instance *plVar3;
  long lVar4;
  lysp_ext_instance *plVar5;
  void *pvVar6;
  
  lydict_remove(ctx->ctx,ext->name);
  lydict_remove(ctx->ctx,ext->argname);
  lydict_remove(ctx->ctx,ext->dsc);
  lydict_remove(ctx->ctx,ext->ref);
  plVar2 = ext->exts;
  if (plVar2 != (lysp_ext_instance *)0x0) {
    plVar5 = (lysp_ext_instance *)0xffffffffffffffff;
    lVar4 = 0;
    do {
      plVar5 = (lysp_ext_instance *)((long)&plVar5->name + 1);
      if (plVar2[-1].exts <= plVar5) {
        free(&plVar2[-1].exts);
        break;
      }
      plVar2 = (lysp_ext_instance *)((long)&plVar2->name + lVar4);
      lVar4 = lVar4 + 0x70;
      lysp_ext_instance_free(ctx,plVar2);
      plVar2 = ext->exts;
    } while (plVar2 != (lysp_ext_instance *)0x0);
  }
  if (ext->compiled != (lysc_ext *)0x0) {
    lVar1 = ly_set_contains(&ctx->ext_set,ext->compiled,(uint32_t *)0x0);
    if (lVar1 == '\0') {
      ly_set_add(&ctx->ext_set,ext->compiled,'\0',(uint32_t *)0x0);
      plVar3 = ext->compiled->exts;
      if (plVar3 != (lysc_ext_instance *)0x0) {
        pvVar6 = (void *)0xffffffffffffffff;
        lVar4 = 0;
        do {
          pvVar6 = (void *)((long)pvVar6 + 1);
          if (plVar3[-1].compiled <= pvVar6) {
            free(&plVar3[-1].compiled);
            break;
          }
          plVar3 = (lysc_ext_instance *)((long)&plVar3->def + lVar4);
          lVar4 = lVar4 + 0x48;
          lysc_ext_instance_free(ctx,plVar3);
          plVar3 = ext->compiled->exts;
        } while (plVar3 != (lysc_ext_instance *)0x0);
      }
      ext->compiled = (lysc_ext *)0x0;
    }
  }
  return;
}

Assistant:

static void
lysp_ext_free(struct lysf_ctx *ctx, struct lysp_ext *ext)
{
    lydict_remove(ctx->ctx, ext->name);
    lydict_remove(ctx->ctx, ext->argname);
    lydict_remove(ctx->ctx, ext->dsc);
    lydict_remove(ctx->ctx, ext->ref);
    FREE_ARRAY(ctx, ext->exts, lysp_ext_instance_free);
    if (ext->compiled) {
        lysc_extension_free(ctx, &ext->compiled);
    }
}